

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_Udev.cpp
# Opt level: O2

void __thiscall axl::sys::lnx::libudev::UdevLib::UdevLib(UdevLib *this)

{
  int iVar1;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_70;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_30;
  
  (this->super_DynamicLib).
  super_Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>.m_h = (void *)0x0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_30,"libudev.so");
  iVar1 = psx::DynamicLib::open(&this->super_DynamicLib,(char *)&local_30,1);
  if ((char)iVar1 == '\0') {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (&local_50,"libudev.so.1");
    iVar1 = psx::DynamicLib::open(&this->super_DynamicLib,(char *)&local_50,1);
    if ((char)iVar1 == '\0') {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                (&local_70,"libudev.so.0");
      psx::DynamicLib::open(&this->super_DynamicLib,(char *)&local_70,1);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_70);
    }
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_50);
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_30);
  return;
}

Assistant:

UdevLib() {
		open("libudev.so") ||
		open("libudev.so.1") ||
		open("libudev.so.0");
	}